

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::_move(xml_document *this,xml_document *rhs)

{
  xml_memory_page *pxVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long *in_RSI;
  long *in_RDI;
  xml_node_struct *node;
  xml_memory_page *page_1;
  xml_memory_page *page;
  xml_memory_page *other_page;
  xml_memory_page *doc_page;
  xml_node_struct *other_first_child;
  xml_document_struct *other;
  xml_document_struct *doc;
  xml_memory_page *in_stack_ffffffffffffff98;
  xml_document_struct *in_stack_ffffffffffffffa0;
  ulong local_50;
  long *local_48;
  
  pxVar1 = (xml_memory_page *)*in_RDI;
  puVar2 = (ulong *)*in_RSI;
  local_50 = puVar2[4];
  if (puVar2[8] != (long)puVar2 - (*puVar2 >> 8)) {
    pxVar1[1].busy_size = puVar2[8];
    pxVar1[1].freed_size = puVar2[9];
  }
  pxVar1[2].allocator = (xml_allocator *)puVar2[10];
  pxVar1[2].prev = (xml_memory_page *)puVar2[0xb];
  in_RDI[1] = in_RSI[1];
  lVar5 = (long)pxVar1 - ((ulong)pxVar1->allocator >> 8);
  uVar3 = *puVar2;
  lVar4 = *(long *)((long)puVar2 + (0x10 - (uVar3 >> 8)));
  if (lVar4 != 0) {
    *(long *)(lVar4 + 8) = lVar5;
    *(long *)(lVar5 + 0x10) = lVar4;
    *(undefined8 *)((long)puVar2 + (0x10 - (uVar3 >> 8))) = 0;
  }
  for (local_48 = *(long **)(lVar5 + 0x10); local_48 != (long *)0x0; local_48 = (long *)local_48[2])
  {
    in_stack_ffffffffffffffa0 = (xml_document_struct *)0x0;
    if (pxVar1 != (xml_memory_page *)0x0) {
      in_stack_ffffffffffffffa0 = (xml_document_struct *)&pxVar1[1].busy_size;
    }
    *local_48 = (long)in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff98 = pxVar1;
  }
  pxVar1->freed_size = local_50;
  for (; local_50 != 0; local_50 = *(ulong *)(local_50 + 0x30)) {
    *(xml_memory_page **)(local_50 + 0x18) = pxVar1;
  }
  impl::anon_unknown_0::xml_document_struct::xml_document_struct
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  in_RSI[1] = 0;
  return;
}

Assistant:

PUGI_IMPL_FN void xml_document::_move(xml_document& rhs) PUGIXML_NOEXCEPT_IF_NOT_COMPACT
	{
		impl::xml_document_struct* doc = static_cast<impl::xml_document_struct*>(_root);
		impl::xml_document_struct* other = static_cast<impl::xml_document_struct*>(rhs._root);

		// save first child pointer for later; this needs hash access
		xml_node_struct* other_first_child = other->first_child;

	#ifdef PUGIXML_COMPACT
		// reserve space for the hash table up front; this is the only operation that can fail
		// if it does, we have no choice but to throw (if we have exceptions)
		if (other_first_child)
		{
			size_t other_children = 0;
			for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
				other_children++;

			// in compact mode, each pointer assignment could result in a hash table request
			// during move, we have to relocate document first_child and parents of all children
			// normally there's just one child and its parent has a pointerless encoding but
			// we assume the worst here
			if (!other->_hash->reserve(other_children + 1))
			{
			#ifdef PUGIXML_NO_EXCEPTIONS
				return;
			#else
				throw std::bad_alloc();
			#endif
			}
		}
	#endif

		// move allocation state
		// note that other->_root may point to the embedded document page, in which case we should keep original (empty) state
		if (other->_root != PUGI_IMPL_GETPAGE(other))
		{
			doc->_root = other->_root;
			doc->_busy_size = other->_busy_size;
		}

		// move buffer state
		doc->buffer = other->buffer;
		doc->extra_buffers = other->extra_buffers;
		_buffer = rhs._buffer;

	#ifdef PUGIXML_COMPACT
		// move compact hash; note that the hash table can have pointers to other but they will be "inactive", similarly to nodes removed with remove_child
		doc->hash = other->hash;
		doc->_hash = &doc->hash;

		// make sure we don't access other hash up until the end when we reinitialize other document
		other->_hash = NULL;
	#endif

		// move page structure
		impl::xml_memory_page* doc_page = PUGI_IMPL_GETPAGE(doc);
		assert(doc_page && !doc_page->prev && !doc_page->next);

		impl::xml_memory_page* other_page = PUGI_IMPL_GETPAGE(other);
		assert(other_page && !other_page->prev);

		// relink pages since root page is embedded into xml_document
		if (impl::xml_memory_page* page = other_page->next)
		{
			assert(page->prev == other_page);

			page->prev = doc_page;

			doc_page->next = page;
			other_page->next = NULL;
		}

		// make sure pages point to the correct document state
		for (impl::xml_memory_page* page = doc_page->next; page; page = page->next)
		{
			assert(page->allocator == other);

			page->allocator = doc;

		#ifdef PUGIXML_COMPACT
			// this automatically migrates most children between documents and prevents ->parent assignment from allocating
			if (page->compact_shared_parent == other)
				page->compact_shared_parent = doc;
		#endif
		}

		// move tree structure
		assert(!doc->first_child);

		doc->first_child = other_first_child;

		for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
		{
		#ifdef PUGIXML_COMPACT
			// most children will have migrated when we reassigned compact_shared_parent
			assert(node->parent == other || node->parent == doc);

			node->parent = doc;
		#else
			assert(node->parent == other);
			node->parent = doc;
		#endif
		}

		// reset other document
		new (other) impl::xml_document_struct(PUGI_IMPL_GETPAGE(other));
		rhs._buffer = NULL;
	}